

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O2

int adt_str_charAt(adt_str_t *self,int index)

{
  int iVar1;
  
  if (self != (adt_str_t *)0x0) {
    if (index < 0) {
      iVar1 = self->s32Cur;
      if (SBORROW4(iVar1,-index) == iVar1 + index < 0) {
        index = index + iVar1;
        goto LAB_00107ab0;
      }
    }
    else if (index < self->s32Cur) {
LAB_00107ab0:
      return (int)self->pAlloc[index];
    }
    self->lastError = '\x03';
  }
  return -1;
}

Assistant:

int adt_str_charAt(adt_str_t *self, int index)
{
   int retval = -1;
   adt_error_t errorCode = ADT_NO_ERROR;
   if(self != 0)
   {
      int32_t s32Index;
      if(index < 0)
      {
         s32Index=(int32_t) (-index);
         if(s32Index <= self->s32Cur)
         {
            s32Index = self->s32Cur-s32Index;
         }
         else
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      else
      {
         s32Index = (int32_t) index;
         if(s32Index >= self->s32Cur)
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      if (errorCode == ADT_NO_ERROR)
      {
         retval = (int) self->pAlloc[s32Index];
      }
      else
      {
         self->lastError = errorCode;
      }
   }
   return retval;

}